

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<long>(uint length,long value1,long value2,bool allowTrash)

{
  _func_int ***ppp_Var1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined1 auVar10 [16];
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long *plVar25;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var26;
  undefined8 *puVar27;
  long *plVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  long *plVar32;
  int iVar33;
  ulong uVar34;
  undefined4 uVar35;
  _Atomic_word _Var36;
  long lStack_b0;
  long *local_a0;
  shared_ptr<long> pv1;
  shared_ptr<long> pv2;
  shared_ptr<long> presult;
  
  plVar25 = nosimd::common::malloc<long>(length);
  std::__shared_ptr<long,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<long,void(*)(long*),void>
            ((__shared_ptr<long,(__gnu_cxx::_Lock_policy)2> *)&local_a0,plVar25,
             nosimd::common::free<long>);
  plVar25 = nosimd::common::malloc<long>(length);
  std::__shared_ptr<long,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<long,void(*)(long*),void>
            ((__shared_ptr<long,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,plVar25,
             nosimd::common::free<long>);
  plVar25 = nosimd::common::malloc<long>(length + 1);
  std::__shared_ptr<long,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<long,void(*)(long*),void>
            ((__shared_ptr<long,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,plVar25,
             nosimd::common::free<long>);
  uVar34 = (ulong)length;
  (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar34] = (_func_int **)0x7f;
  iVar33 = (int)length >> 1;
  plVar25 = local_a0;
  for (iVar30 = iVar33; 3 < iVar30; iVar30 = iVar30 + -4) {
    *plVar25 = value1;
    plVar25[1] = value1;
    plVar25[2] = value1;
    plVar25[3] = value1;
    plVar25[4] = value1;
    plVar25[5] = value1;
    plVar25[6] = value1;
    plVar25[7] = value1;
    plVar25 = plVar25 + 8;
  }
  if (1 < iVar30) {
    *plVar25 = value1;
    plVar25[1] = value1;
    plVar25[2] = value1;
    plVar25[3] = value1;
    iVar30 = iVar30 + -2;
    plVar25 = plVar25 + 4;
  }
  if (iVar30 != 0) {
    *plVar25 = value1;
    plVar25[1] = value1;
  }
  presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)length;
  if (length != 0) {
    local_a0[(long)((long)&presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi[-1]._M_weak_count + 3)] = value1;
  }
  uVar35 = (undefined4)value2;
  _Var36 = (_Atomic_word)((ulong)value2 >> 0x20);
  _Var26 = pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  for (iVar30 = iVar33; 3 < iVar30; iVar30 = iVar30 + -4) {
    _Var3._M_use_count = uVar35;
    _Var3._vptr__Sp_counted_base = (_func_int **)value2;
    _Var3._M_weak_count = _Var36;
    *_Var26._M_pi = _Var3;
    _Var4._M_use_count = uVar35;
    _Var4._vptr__Sp_counted_base = (_func_int **)value2;
    _Var4._M_weak_count = _Var36;
    _Var26._M_pi[1] = _Var4;
    _Var5._M_use_count = uVar35;
    _Var5._vptr__Sp_counted_base = (_func_int **)value2;
    _Var5._M_weak_count = _Var36;
    _Var26._M_pi[2] = _Var5;
    _Var6._M_use_count = uVar35;
    _Var6._vptr__Sp_counted_base = (_func_int **)value2;
    _Var6._M_weak_count = _Var36;
    _Var26._M_pi[3] = _Var6;
    _Var26._M_pi = _Var26._M_pi + 4;
  }
  if (1 < iVar30) {
    _Var7._M_use_count = uVar35;
    _Var7._vptr__Sp_counted_base = (_func_int **)value2;
    _Var7._M_weak_count = _Var36;
    *_Var26._M_pi = _Var7;
    _Var8._M_use_count = uVar35;
    _Var8._vptr__Sp_counted_base = (_func_int **)value2;
    _Var8._M_weak_count = _Var36;
    _Var26._M_pi[1] = _Var8;
    iVar30 = iVar30 + -2;
    _Var26._M_pi = _Var26._M_pi + 2;
  }
  if (iVar30 != 0) {
    _Var9._M_use_count = uVar35;
    _Var9._vptr__Sp_counted_base = (_func_int **)value2;
    _Var9._M_weak_count = _Var36;
    *_Var26._M_pi = _Var9;
  }
  if (length != 0) {
    *(long *)((long)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
             8 + -8) = value2;
  }
  uVar29 = 0;
  while (uVar34 != uVar29) {
    if ((local_a0[uVar29] != value1) ||
       (ppp_Var1 = &(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + uVar29, uVar29 = uVar29 + 1,
       *ppp_Var1 != (_func_int **)value2)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x1a;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  lVar31 = 0;
  for (iVar30 = iVar33; 3 < iVar30; iVar30 = iVar30 + -4) {
    lVar11 = ((long *)((long)local_a0 + lVar31))[1];
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x10);
    lVar12 = *plVar25;
    lVar13 = plVar25[1];
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x20);
    lVar14 = *plVar25;
    lVar15 = plVar25[1];
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x30);
    lVar16 = *plVar25;
    lVar17 = plVar25[1];
    plVar25 = (long *)((long)&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    lVar18 = plVar25[1];
    plVar28 = (long *)((long)&pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar31);
    lVar19 = *plVar28;
    lVar20 = plVar28[1];
    plVar28 = (long *)((long)&pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    lVar21 = *plVar28;
    lVar22 = plVar28[1];
    plVar28 = (long *)((long)&pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar31);
    lVar23 = *plVar28;
    lVar24 = plVar28[1];
    plVar28 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    *plVar28 = *plVar25 + *(long *)((long)local_a0 + lVar31);
    plVar28[1] = lVar18 + lVar11;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar31);
    *plVar25 = lVar19 + lVar12;
    plVar25[1] = lVar20 + lVar13;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    *plVar25 = lVar21 + lVar14;
    plVar25[1] = lVar22 + lVar15;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar31);
    *plVar25 = lVar23 + lVar16;
    plVar25[1] = lVar24 + lVar17;
    lVar31 = lVar31 + 0x40;
  }
  if (iVar30 < 2) {
    plVar25 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    plVar28 = (long *)((long)&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    plVar32 = (long *)(lVar31 + (long)local_a0);
  }
  else {
    plVar2 = (long *)((long)&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar31);
    plVar28 = plVar2 + 4;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    plVar32 = (long *)((long)local_a0 + lVar31 + 0x20);
    lVar31 = plVar32[-3];
    lVar11 = plVar2[1];
    plVar25[-4] = *plVar2 + plVar32[-4];
    plVar25[-3] = lVar11 + lVar31;
    lVar31 = plVar32[-1];
    lVar11 = plVar2[3];
    plVar25[-2] = plVar2[2] + plVar32[-2];
    plVar25[-1] = lVar11 + lVar31;
    iVar30 = iVar30 + -2;
  }
  if (iVar30 != 0) {
    lVar31 = plVar32[1];
    lVar11 = plVar28[1];
    *plVar25 = *plVar28 + *plVar32;
    plVar25[1] = lVar11 + lVar31;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
             8 + -8) =
         *(long *)((long)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  + (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi * 8 + -8) +
         local_a0[(long)((long)&presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[-1]._M_weak_count + 3)];
  }
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 + value1)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x22;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  lVar31 = 0;
  for (iVar30 = iVar33; 3 < iVar30; iVar30 = iVar30 + -4) {
    lVar11 = ((long *)((long)local_a0 + lVar31))[1];
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x10);
    lVar12 = *plVar25;
    lVar13 = plVar25[1];
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x20);
    lVar14 = *plVar25;
    lVar15 = plVar25[1];
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x30);
    lVar16 = *plVar25;
    lVar17 = plVar25[1];
    plVar25 = (long *)((long)&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    lVar18 = plVar25[1];
    plVar28 = (long *)((long)&pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar31);
    lVar19 = *plVar28;
    lVar20 = plVar28[1];
    plVar28 = (long *)((long)&pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    lVar21 = *plVar28;
    lVar22 = plVar28[1];
    plVar28 = (long *)((long)&pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar31);
    lVar23 = *plVar28;
    lVar24 = plVar28[1];
    plVar28 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    *plVar28 = *(long *)((long)local_a0 + lVar31) - *plVar25;
    plVar28[1] = lVar11 - lVar18;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar31);
    *plVar25 = lVar12 - lVar19;
    plVar25[1] = lVar13 - lVar20;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    *plVar25 = lVar14 - lVar21;
    plVar25[1] = lVar15 - lVar22;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar31);
    *plVar25 = lVar16 - lVar23;
    plVar25[1] = lVar17 - lVar24;
    lVar31 = lVar31 + 0x40;
  }
  if (iVar30 < 2) {
    plVar25 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    plVar28 = (long *)((long)&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    plVar32 = (long *)(lVar31 + (long)local_a0);
  }
  else {
    plVar2 = (long *)((long)&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar31);
    plVar28 = plVar2 + 4;
    plVar25 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    plVar32 = (long *)((long)local_a0 + lVar31 + 0x20);
    lVar31 = plVar32[-3];
    lVar11 = plVar2[1];
    plVar25[-4] = plVar32[-4] - *plVar2;
    plVar25[-3] = lVar31 - lVar11;
    lVar31 = plVar32[-1];
    lVar11 = plVar2[3];
    plVar25[-2] = plVar32[-2] - plVar2[2];
    plVar25[-1] = lVar31 - lVar11;
    iVar30 = iVar30 + -2;
  }
  if (iVar30 != 0) {
    lVar31 = plVar32[1];
    lVar11 = plVar28[1];
    *plVar25 = *plVar32 - *plVar28;
    plVar25[1] = lVar31 - lVar11;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
             8 + -8) =
         local_a0[(long)((long)&presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[-1]._M_weak_count + 3)] -
         *(long *)((long)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  + (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi * 8 + -8);
  }
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 - value2)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x2a;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  auVar10._8_4_ = uVar35;
  auVar10._0_8_ = value2;
  auVar10._12_4_ = _Var36;
  nosimd::arithmetic::mul<long>
            (local_a0,(long *)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi,
             (long *)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 * value1)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x32;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<long>
            (local_a0,(long *)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi,
             (long *)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  lStack_b0 = auVar10._8_8_;
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 / value2)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x3a;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  lVar31 = 0;
  for (iVar30 = iVar33; 3 < iVar30; iVar30 = iVar30 + -4) {
    lVar11 = ((long *)((long)local_a0 + lVar31))[1];
    plVar25 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    *plVar25 = *(long *)((long)local_a0 + lVar31) + value2;
    plVar25[1] = lVar11 + lStack_b0;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x10);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar31);
    *plVar28 = *plVar25 + value2;
    plVar28[1] = lVar11 + lStack_b0;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x20);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    *plVar28 = *plVar25 + value2;
    plVar28[1] = lVar11 + lStack_b0;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x30);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar31);
    *plVar28 = *plVar25 + value2;
    plVar28[1] = lVar11 + lStack_b0;
    lVar31 = lVar31 + 0x40;
  }
  if (iVar30 < 2) {
    plVar25 = (long *)((long)local_a0 + lVar31);
    plVar28 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
  }
  else {
    plVar32 = (long *)((long)local_a0 + lVar31);
    plVar25 = plVar32 + 4;
    lVar11 = plVar32[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    plVar28[-4] = *plVar32 + value2;
    plVar28[-3] = lVar11 + lStack_b0;
    lVar31 = plVar32[3];
    plVar28[-2] = plVar32[2] + value2;
    plVar28[-1] = lVar31 + lStack_b0;
    iVar30 = iVar30 + -2;
  }
  if (iVar30 != 0) {
    lVar31 = plVar25[1];
    *plVar28 = *plVar25 + value2;
    plVar28[1] = lVar31 + lStack_b0;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
             8 + -8) =
         local_a0[(long)((long)&presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[-1]._M_weak_count + 3)] + value2;
  }
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 + value1)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x43;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  lVar31 = 0;
  for (iVar30 = iVar33; 3 < iVar30; iVar30 = iVar30 + -4) {
    lVar11 = ((long *)((long)local_a0 + lVar31))[1];
    plVar25 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    *plVar25 = *(long *)((long)local_a0 + lVar31) - value2;
    plVar25[1] = lVar11 - lStack_b0;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x10);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar31);
    *plVar28 = *plVar25 - value2;
    plVar28[1] = lVar11 - lStack_b0;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x20);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    *plVar28 = *plVar25 - value2;
    plVar28[1] = lVar11 - lStack_b0;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x30);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar31);
    *plVar28 = *plVar25 - value2;
    plVar28[1] = lVar11 - lStack_b0;
    lVar31 = lVar31 + 0x40;
  }
  if (iVar30 < 2) {
    plVar25 = (long *)((long)local_a0 + lVar31);
    plVar28 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
  }
  else {
    plVar32 = (long *)((long)local_a0 + lVar31);
    plVar25 = plVar32 + 4;
    lVar11 = plVar32[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    plVar28[-4] = *plVar32 - value2;
    plVar28[-3] = lVar11 - lStack_b0;
    lVar31 = plVar32[3];
    plVar28[-2] = plVar32[2] - value2;
    plVar28[-1] = lVar31 - lStack_b0;
    iVar30 = iVar30 + -2;
  }
  if (iVar30 != 0) {
    lVar31 = plVar25[1];
    *plVar28 = *plVar25 - value2;
    plVar28[1] = lVar31 - lStack_b0;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
             8 + -8) =
         local_a0[(long)((long)&presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[-1]._M_weak_count + 3)] - value2;
  }
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 - value2)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x4b;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  lVar31 = 0;
  for (; 3 < iVar33; iVar33 = iVar33 + -4) {
    lVar11 = ((long *)((long)local_a0 + lVar31))[1];
    plVar25 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
    *plVar25 = value2 - *(long *)((long)local_a0 + lVar31);
    plVar25[1] = lStack_b0 - lVar11;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x10);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar31);
    *plVar28 = value2 - *plVar25;
    plVar28[1] = lStack_b0 - lVar11;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x20);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    *plVar28 = value2 - *plVar25;
    plVar28[1] = lStack_b0 - lVar11;
    plVar25 = (long *)((long)local_a0 + lVar31 + 0x30);
    lVar11 = plVar25[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar31);
    *plVar28 = value2 - *plVar25;
    plVar28[1] = lStack_b0 - lVar11;
    lVar31 = lVar31 + 0x40;
  }
  if (iVar33 < 2) {
    plVar25 = (long *)((long)local_a0 + lVar31);
    plVar28 = (long *)((long)&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar31);
  }
  else {
    plVar32 = (long *)((long)local_a0 + lVar31);
    plVar25 = plVar32 + 4;
    lVar11 = plVar32[1];
    plVar28 = (long *)((long)&pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar31);
    plVar28[-4] = value2 - *plVar32;
    plVar28[-3] = lStack_b0 - lVar11;
    lVar31 = plVar32[3];
    plVar28[-2] = value2 - plVar32[2];
    plVar28[-1] = lStack_b0 - lVar31;
    iVar33 = iVar33 + -2;
  }
  if (iVar33 != 0) {
    lVar31 = plVar25[1];
    *plVar28 = value2 - *plVar25;
    plVar28[1] = lStack_b0 - lVar31;
  }
  if (length != 0) {
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             (long)presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
             8 + -8) =
         value2 - local_a0[(long)((long)&presult.
                                         super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_refcount._M_pi[-1]._M_weak_count + 3)];
  }
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 - value1)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x53;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mulC<long>
            (local_a0,value2,
             (long *)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 * value1)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x5b;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<long>
            (local_a0,value2,
             (long *)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value1 / value2)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 99;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<long>
            (local_a0,value2,
             (long *)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar29 = 0;
  while (uVar34 != uVar29) {
    ppp_Var1 = &(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar29;
    uVar29 = uVar29 + 1;
    if (*ppp_Var1 != (_func_int **)(value2 / value1)) {
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
      *(undefined4 *)(puVar27 + 1) = 0x6b;
      *(uint *)((long)puVar27 + 0xc) = length;
      __cxa_throw(puVar27,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) &&
     ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar34] != (_func_int **)0x7f)) {
    puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar27 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
    *(undefined4 *)(puVar27 + 1) = 0x70;
    *(uint *)((long)puVar27 + 0xc) = length;
    __cxa_throw(puVar27,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}